

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCut.c
# Opt level: O0

void Bmc_GiaGenerateJust(Gia_Man_t *p,Abc_Cex_t *pCex,Vec_Bit_t **pvValues,Vec_Bit_t **pvJustis)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  Vec_Bit_t *vValues_00;
  Vec_Bit_t *p_00;
  Gia_Obj_t *pGVar9;
  bool bVar10;
  int local_60;
  int Shift;
  int fJusti1;
  int fJusti0;
  int fCompl1;
  int fCompl0;
  int iBit;
  int k;
  int i;
  Gia_Obj_t *pObj;
  Vec_Bit_t *vJustis;
  Vec_Bit_t *vValues;
  Vec_Bit_t **pvJustis_local;
  Vec_Bit_t **pvValues_local;
  Abc_Cex_t *pCex_local;
  Gia_Man_t *p_local;
  
  iVar2 = Gia_ManObjNum(p);
  vValues_00 = Vec_BitStart(iVar2 * (pCex->iFrame + 1));
  iVar2 = Gia_ManObjNum(p);
  p_00 = Vec_BitStart(iVar2 * (pCex->iFrame + 1));
  fCompl1 = 0;
  Gia_ManCleanMark0(p);
  Gia_ManCleanMark1(p);
  fCompl0 = 0;
  while( true ) {
    iVar2 = Gia_ManRegNum(p);
    bVar10 = false;
    if (fCompl0 < iVar2) {
      iVar2 = Gia_ManPoNum(p);
      _k = Gia_ManCo(p,iVar2 + fCompl0);
      bVar10 = _k != (Gia_Obj_t *)0x0;
    }
    if (!bVar10) break;
    uVar3 = Abc_InfoHasBit((uint *)(pCex + 1),fCompl1);
    *(ulong *)_k = *(ulong *)_k & 0xffffffffbfffffff | ((ulong)uVar3 & 1) << 0x1e;
    fCompl0 = fCompl0 + 1;
    fCompl1 = fCompl1 + 1;
  }
  iBit = 0;
  local_60 = 0;
  while (iBit <= pCex->iFrame) {
    fCompl0 = 0;
    while( true ) {
      bVar10 = false;
      if (fCompl0 < p->nObjs) {
        _k = Gia_ManObj(p,fCompl0);
        bVar10 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar10) break;
      iVar2 = Gia_ObjIsAnd(_k);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjIsCi(_k);
        if (iVar2 == 0) {
          iVar2 = Gia_ObjIsCo(_k);
          if (iVar2 == 0) {
            iVar2 = Gia_ObjIsConst0(_k);
            if (iVar2 == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                            ,0x9e,
                            "void Bmc_GiaGenerateJust(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, Vec_Bit_t **)"
                           );
            }
            *(ulong *)_k = *(ulong *)_k & 0xbfffffffffffffff | 0x4000000000000000;
          }
          else {
            pGVar9 = Gia_ObjFanin0(_k);
            uVar1 = *(ulong *)pGVar9;
            uVar3 = Gia_ObjFaninC0(_k);
            *(ulong *)_k = *(ulong *)_k & 0xffffffffbfffffff |
                           ((ulong)((uint)(uVar1 >> 0x1e) & 1 ^ uVar3) & 1) << 0x1e;
            pGVar9 = Gia_ObjFanin0(_k);
            *(ulong *)_k = *(ulong *)_k & 0xbfffffffffffffff |
                           (ulong)((uint)((ulong)*(undefined8 *)pGVar9 >> 0x3e) & 1) << 0x3e;
          }
        }
        else {
          iVar2 = Gia_ObjIsPi(p,_k);
          if (iVar2 == 0) {
            pGVar9 = Gia_ObjRoToRi(p,_k);
            *(ulong *)_k = *(ulong *)_k & 0xffffffffbfffffff |
                           (ulong)((uint)(*(ulong *)pGVar9 >> 0x1e) & 1) << 0x1e;
            pGVar9 = Gia_ObjRoToRi(p,_k);
            *(ulong *)_k = *(ulong *)_k & 0xbfffffffffffffff |
                           (ulong)((uint)((ulong)*(undefined8 *)pGVar9 >> 0x3e) & 1) << 0x3e;
          }
          else {
            uVar3 = Abc_InfoHasBit((uint *)(pCex + 1),fCompl1);
            *(ulong *)_k = *(ulong *)_k & 0xffffffffbfffffff | ((ulong)uVar3 & 1) << 0x1e;
            *(ulong *)_k = *(ulong *)_k & 0xbfffffffffffffff | 0x4000000000000000;
            fCompl1 = fCompl1 + 1;
          }
        }
      }
      else {
        pGVar9 = Gia_ObjFanin0(_k);
        uVar1 = *(ulong *)pGVar9;
        uVar3 = Gia_ObjFaninC0(_k);
        uVar3 = (uint)(uVar1 >> 0x1e) & 1 ^ uVar3;
        pGVar9 = Gia_ObjFanin1(_k);
        uVar1 = *(ulong *)pGVar9;
        uVar4 = Gia_ObjFaninC1(_k);
        uVar4 = (uint)(uVar1 >> 0x1e) & 1 ^ uVar4;
        pGVar9 = Gia_ObjFanin0(_k);
        uVar5 = (uint)((ulong)*(undefined8 *)pGVar9 >> 0x3e) & 1;
        pGVar9 = Gia_ObjFanin1(_k);
        uVar6 = (uint)((ulong)*(undefined8 *)pGVar9 >> 0x3e) & 1;
        *(ulong *)_k = *(ulong *)_k & 0xffffffffbfffffff | ((ulong)(uVar3 & uVar4) & 1) << 0x1e;
        if ((*(ulong *)_k >> 0x1e & 1) == 0) {
          if ((uVar3 == 0) && (uVar4 == 0)) {
            *(ulong *)_k = *(ulong *)_k & 0xbfffffffffffffff | (ulong)(uVar5 | uVar6) << 0x3e;
          }
          else if (uVar3 == 0) {
            *(ulong *)_k = *(ulong *)_k & 0xbfffffffffffffff | (ulong)uVar5 << 0x3e;
          }
          else {
            if (uVar4 != 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                            ,0x88,
                            "void Bmc_GiaGenerateJust(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, Vec_Bit_t **)"
                           );
            }
            *(ulong *)_k = *(ulong *)_k & 0xbfffffffffffffff | (ulong)uVar6 << 0x3e;
          }
        }
        else {
          *(ulong *)_k = *(ulong *)_k & 0xbfffffffffffffff | (ulong)(uVar5 & uVar6) << 0x3e;
        }
      }
      if ((*(ulong *)_k >> 0x1e & 1) != 0) {
        Vec_BitWriteEntry(vValues_00,local_60 + fCompl0,1);
      }
      if ((*(ulong *)_k >> 0x3e & 1) != 0) {
        Vec_BitWriteEntry(p_00,local_60 + fCompl0,1);
      }
      fCompl0 = fCompl0 + 1;
    }
    iBit = iBit + 1;
    iVar2 = Gia_ManObjNum(p);
    local_60 = iVar2 + local_60;
  }
  if (fCompl1 != pCex->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                  ,0xa5,
                  "void Bmc_GiaGenerateJust(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, Vec_Bit_t **)");
  }
  Gia_ManCleanMark0(p);
  Gia_ManCleanMark1(p);
  pGVar9 = Gia_ManPo(p,pCex->iPo);
  iVar7 = Gia_ManObjNum(p);
  iVar2 = pCex->iFrame;
  iVar8 = Gia_ObjId(p,pGVar9);
  iVar2 = Vec_BitEntry(p_00,iVar7 * iVar2 + iVar8);
  if (iVar2 != 0) {
    __assert_fail("Vec_BitEntry(vJustis, Gia_ManObjNum(p) * pCex->iFrame + Gia_ObjId(p, pObj)) == 0"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                  ,0xaa,
                  "void Bmc_GiaGenerateJust(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, Vec_Bit_t **)");
  }
  iVar7 = Gia_ManObjNum(p);
  iVar2 = pCex->iFrame;
  iVar8 = Gia_ObjId(p,pGVar9);
  Vec_BitWriteEntry(p_00,iVar7 * iVar2 + iVar8,1);
  Bmc_GiaGenerateJustNonRec(p,pCex->iFrame,vValues_00,p_00);
  iVar7 = Gia_ManObjNum(p);
  iVar2 = pCex->iFrame;
  iVar8 = Gia_ObjId(p,pGVar9);
  iVar2 = Vec_BitEntry(p_00,iVar7 * iVar2 + iVar8);
  if (iVar2 != 1) {
    __assert_fail("Vec_BitEntry(vJustis, Gia_ManObjNum(p) * pCex->iFrame + Gia_ObjId(p, pObj)) == 1"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                  ,0xae,
                  "void Bmc_GiaGenerateJust(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, Vec_Bit_t **)");
  }
  *pvValues = vValues_00;
  *pvJustis = p_00;
  return;
}

Assistant:

void Bmc_GiaGenerateJust( Gia_Man_t * p, Abc_Cex_t * pCex, Vec_Bit_t ** pvValues, Vec_Bit_t ** pvJustis )
{
    Vec_Bit_t * vValues = Vec_BitStart( Gia_ManObjNum(p) * (pCex->iFrame + 1) );
    Vec_Bit_t * vJustis = Vec_BitStart( Gia_ManObjNum(p) * (pCex->iFrame + 1) );
    Gia_Obj_t * pObj;
    int i, k, iBit = 0, fCompl0, fCompl1, fJusti0, fJusti1, Shift;

    Gia_ManCleanMark0(p);
    Gia_ManCleanMark1(p);
    Gia_ManForEachRi( p, pObj, k )
        pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
    for ( Shift = i = 0; i <= pCex->iFrame; i++, Shift += Gia_ManObjNum(p) )
    {
        Gia_ManForEachObj( p, pObj, k )
        {
            if ( Gia_ObjIsAnd(pObj) )
            {
                fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
                fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
                fJusti0 = Gia_ObjFanin0(pObj)->fMark1;
                fJusti1 = Gia_ObjFanin1(pObj)->fMark1;
                pObj->fMark0 = fCompl0 & fCompl1;
                if ( pObj->fMark0 )
                    pObj->fMark1 = fJusti0 & fJusti1;
                else if ( !fCompl0 && !fCompl1 )
                    pObj->fMark1 = fJusti0 | fJusti1;
                else if ( !fCompl0 )
                    pObj->fMark1 = fJusti0;
                else if ( !fCompl1 )
                    pObj->fMark1 = fJusti1;
                else assert( 0 );
            }
            else if ( Gia_ObjIsCi(pObj) )
            {
                if ( Gia_ObjIsPi(p, pObj) )
                {
                    pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
                    pObj->fMark1 = 1;
                }
                else
                {
                    pObj->fMark0 = Gia_ObjRoToRi(p, pObj)->fMark0;
                    pObj->fMark1 = Gia_ObjRoToRi(p, pObj)->fMark1;
                }
            }
            else if ( Gia_ObjIsCo(pObj) )
            {
                pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
            }
            else if ( Gia_ObjIsConst0(pObj) )
                pObj->fMark1 = 1;
            else assert( 0 );
            if ( pObj->fMark0 )
                Vec_BitWriteEntry( vValues, Shift + k, 1 );
            if ( pObj->fMark1 )
                Vec_BitWriteEntry( vJustis, Shift + k, 1 );
        }
    }
    assert( iBit == pCex->nBits );
    Gia_ManCleanMark0(p);
    Gia_ManCleanMark1(p);
    // perform backward traversal to mark just nodes
    pObj = Gia_ManPo( p, pCex->iPo );
    assert( Vec_BitEntry(vJustis, Gia_ManObjNum(p) * pCex->iFrame + Gia_ObjId(p, pObj)) == 0 );
//    Bmc_GiaGenerateJust_rec( p, pCex->iFrame, Gia_ObjId(p, pObj), vValues, vJustis );
    Vec_BitWriteEntry(vJustis, Gia_ManObjNum(p) * pCex->iFrame + Gia_ObjId(p, pObj), 1);
    Bmc_GiaGenerateJustNonRec( p, pCex->iFrame, vValues, vJustis );
    assert( Vec_BitEntry(vJustis, Gia_ManObjNum(p) * pCex->iFrame + Gia_ObjId(p, pObj)) == 1 );

    // return the result
    *pvValues = vValues;
    *pvJustis = vJustis;
}